

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfuturewatcher.cpp
# Opt level: O1

void __thiscall
QFutureWatcherBase::disconnectOutputInterface(QFutureWatcherBase *this,bool pendingAssignment)

{
  QObjectData *pQVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000031;
  qsizetype *iface;
  
  if ((int)CONCAT71(in_register_00000031,pendingAssignment) != 0) {
    *(undefined4 *)&(this->super_QObject).d_ptr.d[1].field_0x30 = 0;
  }
  iVar2 = (*(this->super_QObject)._vptr_QObject[0xd])(this);
  pQVar1 = (this->super_QObject).d_ptr.d;
  iface = &pQVar1[1].children.d.size;
  if (pQVar1 == (QObjectData *)0x0) {
    iface = (qsizetype *)0x0;
  }
  QFutureInterfaceBasePrivate::disconnectOutputInterface
            (*(QFutureInterfaceBasePrivate **)(CONCAT44(extraout_var,iVar2) + 8),
             (QFutureCallOutInterface *)iface);
  return;
}

Assistant:

void QFutureWatcherBase::disconnectOutputInterface(bool pendingAssignment)
{
    if (pendingAssignment) {
        Q_D(QFutureWatcherBase);
        d->pendingResultsReady.storeRelaxed(0);
    }

    futureInterface().d->disconnectOutputInterface(d_func());
}